

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopItemFlag(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  
  pIVar2 = GImGui;
  iVar1 = (GImGui->ItemFlagsStack).Size;
  if (1 < iVar1) {
    uVar3 = iVar1 - 1;
    (GImGui->ItemFlagsStack).Size = uVar3;
    (pIVar2->CurrentWindow->DC).ItemFlags = (pIVar2->ItemFlagsStack).Data[(ulong)uVar3 - 1];
    return;
  }
  __assert_fail("g.ItemFlagsStack.Size > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                ,0x18ec,"void ImGui::PopItemFlag()");
}

Assistant:

void ImGui::PopItemFlag()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.ItemFlagsStack.Size > 1); // Too many calls to PopItemFlag() - we always leave a 0 at the bottom of the stack.
    g.ItemFlagsStack.pop_back();
    window->DC.ItemFlags = g.ItemFlagsStack.back();
}